

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O1

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrSceneComputeFeatureMSFT value)

{
  pointer pbVar1;
  int iVar2;
  pointer pbVar3;
  bool bVar4;
  string vuid;
  string error_str;
  string local_d8;
  string local_b8;
  string *local_98;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_90;
  string *local_88;
  string *local_80;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_48;
  
  local_98 = command_name;
  local_90 = objects_info;
  local_88 = item_name;
  local_80 = validation_name;
  if (instance_info != (GenValidUsageXrInstanceInfo *)0x0) {
    pbVar3 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pbVar3 != pbVar1;
    if (bVar4) {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      while (iVar2 != 0) {
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 != pbVar1;
        if (pbVar3 == pbVar1) break;
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      }
    }
    if (!bVar4) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"VUID-","");
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_80->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_d8);
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_88->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)&local_d8);
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"XrSceneComputeFeatureMSFT requires extension ","");
      std::__cxx11::string::append((char *)&local_b8);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_48,local_90);
      CoreValidLogMessage(instance_info,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_98,
                          &local_48,&local_b8);
      local_60.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_48.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_60.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_48.
           super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      goto joined_r0x00148512;
    }
  }
  if (value - XR_SCENE_COMPUTE_FEATURE_PLANE_MSFT < 4) {
    return true;
  }
  if (value == XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT) {
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
      return true;
    }
    pbVar3 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pbVar3 != pbVar1;
    if (bVar4) {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      while (iVar2 != 0) {
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 != pbVar1;
        if (pbVar3 == pbVar1) break;
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      }
    }
    if (bVar4) {
      return true;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"VUID-","");
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_80->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_d8);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_88->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_d8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "XrSceneComputeFeatureMSFT value \"XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT\"","");
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::append((char *)&local_b8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_78,local_90);
    CoreValidLogMessage(instance_info,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_98,&local_78,
                        &local_b8);
    local_60.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_78.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_60.
    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.
         super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    if (value != XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT) {
      return false;
    }
    if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
      return true;
    }
    pbVar3 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = pbVar3 != pbVar1;
    if (bVar4) {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      while (iVar2 != 0) {
        pbVar3 = pbVar3 + 1;
        bVar4 = pbVar3 != pbVar1;
        if (pbVar3 == pbVar1) break;
        iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      }
    }
    if (bVar4) {
      return true;
    }
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"VUID-","");
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_80->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_d8);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)(local_88->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_d8);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "XrSceneComputeFeatureMSFT value \"XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT\"",
               "");
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::append((char *)&local_b8);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_60,local_90);
    CoreValidLogMessage(instance_info,&local_d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_98,&local_60,
                        &local_b8);
  }
joined_r0x00148512:
  if (local_60.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrSceneComputeFeatureMSFT value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_MSFT_scene_understanding, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_scene_understanding")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrSceneComputeFeatureMSFT requires extension ";
        error_str += " \"XR_MSFT_scene_understanding\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_SCENE_COMPUTE_FEATURE_PLANE_MSFT:
            return true;
        case XR_SCENE_COMPUTE_FEATURE_PLANE_MESH_MSFT:
            return true;
        case XR_SCENE_COMPUTE_FEATURE_VISUAL_MESH_MSFT:
            return true;
        case XR_SCENE_COMPUTE_FEATURE_COLLIDER_MESH_MSFT:
            return true;
        case XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT:
            // Enum value XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT requires extension XR_MSFT_scene_understanding_serialization, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_scene_understanding_serialization")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSceneComputeFeatureMSFT value \"XR_SCENE_COMPUTE_FEATURE_SERIALIZE_SCENE_MSFT\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_MSFT_scene_understanding_serialization\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
        case XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT:
            // Enum value XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT requires extension XR_MSFT_scene_marker, so check that it is enabled
            if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_MSFT_scene_marker")) {
                std::string vuid = "VUID-";
                vuid += validation_name;
                vuid += "-";
                vuid += item_name;
                vuid += "-parameter";
                std::string error_str = "XrSceneComputeFeatureMSFT value \"XR_SCENE_COMPUTE_FEATURE_MARKER_MSFT\"";
                error_str += " being used, which requires extension ";
                error_str += " \"XR_MSFT_scene_marker\" to be enabled, but it is not enabled";
                CoreValidLogMessage(instance_info, vuid,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info, error_str);
                return false;
            }
            return true;
    default:
        return false;
}
}